

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

void cppcms::xss::anon_unknown_8::load_from_json(rules *r,value *v)

{
  undefined *puVar1;
  bool bVar2;
  json_type jVar3;
  size_type sVar4;
  ulong uVar5;
  undefined8 uVar6;
  ostream *poVar7;
  reference pvVar8;
  size_type sVar9;
  string *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar10;
  ostringstream ss_2;
  bad_value_cast *anon_var_0;
  ostringstream ss_1;
  string *attr_3;
  string *tag_2;
  size_t j_3;
  string scheme;
  bool absolute_only;
  validator_type validator;
  regex rg;
  string *attr_2;
  string *tag_1;
  size_t j_2;
  string type;
  string attr_1;
  string tag;
  size_t j_1;
  array *ar;
  ostringstream ss;
  value *pairs;
  size_t k;
  size_t j;
  str_vec names;
  str_vec tags;
  value *attr;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  all_new_pairs;
  size_t i_1;
  set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  all_tags_attrs;
  array *attributes;
  value attrs_val;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_tags;
  string encoding;
  size_t i;
  str_vec entities;
  int pos2;
  int pos;
  char *last;
  undefined4 in_stack_fffffffffffff1f8;
  html_type in_stack_fffffffffffff1fc;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff208;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff210;
  value_type *in_stack_fffffffffffff218;
  function<bool_(const_char_*,_const_char_*)> *in_stack_fffffffffffff220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff228;
  char *in_stack_fffffffffffff230;
  value *in_stack_fffffffffffff238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff240;
  undefined5 in_stack_fffffffffffff248;
  undefined1 in_stack_fffffffffffff24d;
  undefined1 in_stack_fffffffffffff24e;
  undefined1 in_stack_fffffffffffff24f;
  string *in_stack_fffffffffffff250;
  reference in_stack_fffffffffffff258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff260;
  undefined6 in_stack_fffffffffffff268;
  undefined1 in_stack_fffffffffffff26e;
  undefined1 in_stack_fffffffffffff26f;
  char *in_stack_fffffffffffff2e0;
  value *in_stack_fffffffffffff2e8;
  allocator *paVar11;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff2f0;
  undefined8 in_stack_fffffffffffff2f8;
  tag_type type_00;
  string *in_stack_fffffffffffff300;
  value *in_stack_fffffffffffff308;
  rules *in_stack_fffffffffffff310;
  ostringstream local_880 [408];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6e8;
  reference local_6e0;
  ulong local_6d8;
  allocator local_6a9;
  string local_6a8 [32];
  string local_688 [39];
  undefined1 local_661;
  string local_660 [32];
  regex local_640 [40];
  regex local_618 [15];
  undefined1 local_609;
  _Base_ptr local_5a8;
  undefined1 local_5a0;
  _Base_ptr local_598;
  undefined1 local_590;
  undefined1 local_581;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_540;
  reference local_538;
  ulong local_530;
  string local_528 [38];
  undefined1 local_502;
  allocator local_501;
  string local_500 [96];
  string local_4a0 [32];
  string local_480 [32];
  ulong local_460;
  vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *local_458;
  undefined1 local_449;
  ostringstream local_428 [376];
  value *local_2b0;
  ulong local_268;
  ulong local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  const_reference local_1f8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [32];
  ulong local_1b0;
  array *local_178;
  undefined1 local_16a;
  allocator local_169;
  string local_168 [36];
  undefined4 local_144;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [80];
  string local_90 [32];
  ulong local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_21;
  undefined4 local_20;
  undefined4 local_1c;
  char *local_18;
  string *local_8;
  
  local_1c = 0xffffffff;
  local_20 = 0xffffffff;
  local_18 = "xhtml";
  local_21 = 1;
  local_8 = in_RDI;
  json::value::get<bool>
            ((value *)in_stack_fffffffffffff228,(char *)in_stack_fffffffffffff220,
             (bool *)in_stack_fffffffffffff218);
  rules::html((rules *)in_stack_fffffffffffff200,in_stack_fffffffffffff1fc);
  local_18 = "comments";
  local_35 = 0;
  json::value::get<bool>
            ((value *)in_stack_fffffffffffff228,(char *)in_stack_fffffffffffff220,
             (bool *)in_stack_fffffffffffff218);
  rules::comments_allowed
            ((rules *)in_stack_fffffffffffff200,SUB41(in_stack_fffffffffffff1fc >> 0x18,0));
  local_18 = "numeric_entities";
  local_36 = 0;
  json::value::get<bool>
            ((value *)in_stack_fffffffffffff228,(char *)in_stack_fffffffffffff220,
             (bool *)in_stack_fffffffffffff218);
  rules::numeric_entities_allowed
            ((rules *)in_stack_fffffffffffff200,SUB41(in_stack_fffffffffffff1fc >> 0x18,0));
  local_18 = "entities";
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4560f4);
  json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffff238,in_stack_fffffffffffff230,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff210);
  local_70 = 0;
  while( true ) {
    uVar5 = local_70;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_50);
    type_00 = (tag_type)((ulong)in_stack_fffffffffffff2f8 >> 0x20);
    if (sVar4 <= uVar5) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_50,local_70);
    rules::add_entity((rules *)in_stack_fffffffffffff200,
                      (string *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
    local_70 = local_70 + 1;
  }
  local_18 = "encoding";
  json::value::get_abi_cxx11_
            ((value *)CONCAT17(in_stack_fffffffffffff26f,
                               CONCAT16(in_stack_fffffffffffff26e,in_stack_fffffffffffff268)),
             (char *)in_stack_fffffffffffff260,(char *)in_stack_fffffffffffff258);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    rules::encoding((rules *)in_stack_fffffffffffff200,
                    (string *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x456289);
  local_18 = "tags.opening_and_closing";
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"opening_and_closing",&local_e1);
  load_tags_from_json(in_stack_fffffffffffff310,in_stack_fffffffffffff308,in_stack_fffffffffffff300,
                      type_00,in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  local_18 = "tags.stand_alone";
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"stand_alone",&local_109);
  load_tags_from_json(in_stack_fffffffffffff310,in_stack_fffffffffffff308,in_stack_fffffffffffff300,
                      type_00,in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  local_18 = "tags.any_tag";
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"any_tag",&local_131);
  load_tags_from_json(in_stack_fffffffffffff310,in_stack_fffffffffffff308,in_stack_fffffffffffff300,
                      type_00,in_stack_fffffffffffff2f0);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  json::value::find(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0);
  json::value::value((value *)in_stack_fffffffffffff200,
                     (value *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
  bVar2 = json::value::is_undefined((value *)0x4564c3);
  if (bVar2) {
    local_144 = 1;
  }
  else {
    jVar3 = json::value::type((value *)0x456606);
    if (jVar3 != is_array) {
      local_16a = 1;
      uVar6 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_168,"xss::rules: attributes is expected to be an array",&local_169);
      cppcms_error::cppcms_error
                ((cppcms_error *)in_stack_fffffffffffff200,
                 (string *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
      local_16a = 0;
      __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
    }
    local_178 = json::value::array((value *)0x45671a);
    std::
    set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::set((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x456741);
    for (local_1b0 = 0; uVar5 = local_1b0,
        sVar4 = std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::size
                          (local_178), uVar5 < sVar4; local_1b0 = local_1b0 + 1) {
      local_1c = (undefined4)local_1b0;
      std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::operator[]
                (local_178,local_1b0);
      jVar3 = json::value::type((value *)0x4567a9);
      if (jVar3 != is_object) {
        local_1d2 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1d0,"xss::rules: attributes is expected to be an array of objects",
                   &local_1d1);
        cppcms_error::cppcms_error
                  ((cppcms_error *)in_stack_fffffffffffff200,
                   (string *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
        local_1d2 = 0;
        __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)0x4568d6);
      local_1f8 = std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::operator[]
                            (local_178,local_1b0);
      local_18 = "attributes[{1}].tags";
      local_228 = 0;
      uStack_220 = 0;
      local_218 = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x45693e);
      json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (in_stack_fffffffffffff238,in_stack_fffffffffffff230,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff228);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff210);
      local_18 = "attributes[{1}].attributes";
      local_258 = 0;
      uStack_250 = 0;
      local_248 = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x4569bc);
      json::value::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (in_stack_fffffffffffff238,in_stack_fffffffffffff230,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff228);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff210);
      for (local_260 = 0; uVar5 = local_260,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_210), uVar5 < sVar4; local_260 = local_260 + 1) {
        for (local_268 = 0; uVar5 = local_268,
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&local_240), uVar5 < sVar4; local_268 = local_268 + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_210,local_260);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_240,local_268);
          std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                    (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->first);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff200,
                      (value_type *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(in_stack_fffffffffffff200);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff210);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff210);
      local_2b0 = json::value::find(in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0);
      bVar2 = json::value::is_undefined((value *)0x456bed);
      if (!bVar2) {
        jVar3 = json::value::type((value *)0x456c14);
        if (jVar3 != is_array) {
          std::__cxx11::ostringstream::ostringstream(local_428);
          poVar7 = std::operator<<((ostream *)local_428,
                                   "xss::rules: invalid object type for attributes[");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1b0);
          std::operator<<(poVar7,"].pairs");
          local_449 = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::__cxx11::ostringstream::str();
          cppcms_error::cppcms_error
                    ((cppcms_error *)in_stack_fffffffffffff200,
                     (string *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
          local_449 = 0;
          __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
        local_458 = json::value::array((value *)0x456dbe);
        local_460 = 0;
        while (uVar5 = local_460,
              sVar4 = std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::size
                                (local_458), uVar5 < sVar4) {
          local_20 = (undefined4)local_460;
          local_18 = "attributes[{1}].pairs[{2}].tag";
          std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::operator[]
                    (local_458,local_460);
          json::value::get<std::__cxx11::string>
                    ((value *)in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
          local_18 = "attributes[{1}].pairs[{2}].attr";
          std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::operator[]
                    (local_458,local_460);
          json::value::get<std::__cxx11::string>
                    ((value *)in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
          std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                    (in_stack_fffffffffffff208,&in_stack_fffffffffffff200->first);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff200,
                      (value_type *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(in_stack_fffffffffffff200);
          std::__cxx11::string::~string(local_4a0);
          std::__cxx11::string::~string(local_480);
          local_460 = local_460 + 1;
        }
      }
      bVar2 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff210);
      if (bVar2) {
        local_502 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        paVar11 = &local_501;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_500,"xss::rules: no tags/attributes defined in attributes",paVar11);
        cppcms_error::cppcms_error
                  ((cppcms_error *)in_stack_fffffffffffff200,
                   (string *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
        local_502 = 0;
        __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
      local_18 = "attributes[{1}].type";
      json::value::get<std::__cxx11::string>
                ((value *)in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
      for (local_530 = 0; uVar5 = local_530,
          sVar4 = std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::size(&local_1f0), uVar5 < sVar4; local_530 = local_530 + 1) {
        local_538 = std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&local_1f0,local_530);
        pvVar8 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_1f0,local_530);
        local_540 = &pvVar8->second;
        sVar9 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(in_stack_fffffffffffff210,in_stack_fffffffffffff208);
        if (sVar9 != 1) {
          local_581 = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::operator+((char *)CONCAT17(in_stack_fffffffffffff24f,
                                          CONCAT16(in_stack_fffffffffffff24e,
                                                   CONCAT15(in_stack_fffffffffffff24d,
                                                            in_stack_fffffffffffff248))),
                         in_stack_fffffffffffff240);
          std::operator+(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
          cppcms_error::cppcms_error
                    ((cppcms_error *)in_stack_fffffffffffff200,
                     (string *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
          local_581 = 0;
          __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&local_1f0,local_530);
        pVar10 = std::
                 set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::insert((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff220,in_stack_fffffffffffff218);
        local_5a8 = (_Base_ptr)pVar10.first._M_node;
        local_5a0 = pVar10.second;
        local_598 = local_5a8;
        local_590 = local_5a0;
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          local_609 = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::operator+((char *)CONCAT17(in_stack_fffffffffffff24f,
                                          CONCAT16(in_stack_fffffffffffff24e,
                                                   CONCAT15(in_stack_fffffffffffff24d,
                                                            in_stack_fffffffffffff248))),
                         in_stack_fffffffffffff240);
          std::operator+(in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
          std::operator+(in_stack_fffffffffffff208,&in_stack_fffffffffffff200->first);
          cppcms_error::cppcms_error
                    ((cppcms_error *)in_stack_fffffffffffff200,
                     (string *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
          local_609 = 0;
          __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
      }
      booster::regex::regex(local_618);
      std::function<bool_(const_char_*,_const_char_*)>::function
                ((function<bool_(const_char_*,_const_char_*)> *)in_stack_fffffffffffff200);
      bVar2 = std::operator==(&in_stack_fffffffffffff200->first,
                              (char *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8))
      ;
      if (bVar2) {
        local_18 = "attributes[{1}].expression";
        json::value::get<std::__cxx11::string>
                  ((value *)in_stack_fffffffffffff208,(char *)in_stack_fffffffffffff200);
        booster::regex::regex(local_640,local_660,0);
        booster::regex::operator=(local_618,local_640);
        booster::regex::~regex(local_640);
        std::__cxx11::string::~string(local_660);
      }
      bVar2 = std::operator==(&in_stack_fffffffffffff200->first,
                              (char *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8))
      ;
      if ((bVar2) ||
         (bVar2 = std::operator==(&in_stack_fffffffffffff200->first,
                                  (char *)CONCAT44(in_stack_fffffffffffff1fc,
                                                   in_stack_fffffffffffff1f8)), bVar2)) {
        local_661 = std::operator!=(&in_stack_fffffffffffff200->first,
                                    (char *)CONCAT44(in_stack_fffffffffffff1fc,
                                                     in_stack_fffffffffffff1f8));
        puVar1 = basic_allowed_schemes;
        local_18 = "attributes[{1}].scheme";
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6a8,puVar1,&local_6a9);
        json::value::get<std::__cxx11::string>
                  (in_stack_fffffffffffff238,in_stack_fffffffffffff230,in_stack_fffffffffffff228);
        std::__cxx11::string::~string(local_6a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
        rules::uri_validator
                  ((string *)
                   CONCAT17(in_stack_fffffffffffff24f,
                            CONCAT16(in_stack_fffffffffffff24e,
                                     CONCAT15(in_stack_fffffffffffff24d,in_stack_fffffffffffff248)))
                   ,SUB81((ulong)in_stack_fffffffffffff240 >> 0x38,0));
        std::function<bool_(const_char_*,_const_char_*)>::operator=
                  (in_stack_fffffffffffff220,
                   (function<bool_(const_char_*,_const_char_*)> *)in_stack_fffffffffffff218);
        std::function<bool_(const_char_*,_const_char_*)>::~function
                  ((function<bool_(const_char_*,_const_char_*)> *)0x45770b);
        std::__cxx11::string::~string(local_688);
      }
      for (local_6d8 = 0; uVar5 = local_6d8,
          sVar4 = std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::size(&local_1f0), uVar5 < sVar4; local_6d8 = local_6d8 + 1) {
        local_6e0 = std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&local_1f0,local_6d8);
        pvVar8 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_1f0,local_6d8);
        local_6e8 = &pvVar8->second;
        bVar2 = std::operator==(&in_stack_fffffffffffff200->first,
                                (char *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8
                                                ));
        if (bVar2) {
          rules::add_boolean_property
                    ((rules *)in_stack_fffffffffffff250,
                     (string *)
                     CONCAT17(in_stack_fffffffffffff24f,
                              CONCAT16(in_stack_fffffffffffff24e,
                                       CONCAT15(in_stack_fffffffffffff24d,in_stack_fffffffffffff248)
                                      )),in_stack_fffffffffffff240);
        }
        else {
          bVar2 = std::operator==(&in_stack_fffffffffffff200->first,
                                  (char *)CONCAT44(in_stack_fffffffffffff1fc,
                                                   in_stack_fffffffffffff1f8));
          if (bVar2) {
            rules::add_integer_property
                      ((rules *)in_stack_fffffffffffff250,
                       (string *)
                       CONCAT17(in_stack_fffffffffffff24f,
                                CONCAT16(in_stack_fffffffffffff24e,
                                         CONCAT15(in_stack_fffffffffffff24d,
                                                  in_stack_fffffffffffff248))),
                       in_stack_fffffffffffff240);
          }
          else {
            bVar2 = std::operator==(&in_stack_fffffffffffff200->first,
                                    (char *)CONCAT44(in_stack_fffffffffffff1fc,
                                                     in_stack_fffffffffffff1f8));
            if (bVar2) {
              in_stack_fffffffffffff250 = local_8;
              in_stack_fffffffffffff258 = local_6e0;
              in_stack_fffffffffffff260 = local_6e8;
              rules::relative_uri_validator();
              rules::add_property((rules *)in_stack_fffffffffffff210,in_stack_fffffffffffff208,
                                  &in_stack_fffffffffffff200->first,
                                  (validator_type *)
                                  CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
              std::function<bool_(const_char_*,_const_char_*)>::~function
                        ((function<bool_(const_char_*,_const_char_*)> *)0x457924);
            }
            else {
              in_stack_fffffffffffff24f =
                   std::operator==(&in_stack_fffffffffffff200->first,
                                   (char *)CONCAT44(in_stack_fffffffffffff1fc,
                                                    in_stack_fffffffffffff1f8));
              if ((bool)in_stack_fffffffffffff24f) {
                rules::add_property((rules *)in_stack_fffffffffffff260,
                                    &in_stack_fffffffffffff258->first,in_stack_fffffffffffff250,
                                    (regex *)CONCAT17(in_stack_fffffffffffff24f,
                                                      CONCAT16(in_stack_fffffffffffff24e,
                                                               CONCAT15(in_stack_fffffffffffff24d,
                                                                        in_stack_fffffffffffff248)))
                                   );
              }
              else {
                in_stack_fffffffffffff24e =
                     std::operator==(&in_stack_fffffffffffff200->first,
                                     (char *)CONCAT44(in_stack_fffffffffffff1fc,
                                                      in_stack_fffffffffffff1f8));
                if ((!(bool)in_stack_fffffffffffff24e) &&
                   (in_stack_fffffffffffff24d =
                         std::operator==(&in_stack_fffffffffffff200->first,
                                         (char *)CONCAT44(in_stack_fffffffffffff1fc,
                                                          in_stack_fffffffffffff1f8)),
                   !(bool)in_stack_fffffffffffff24d)) {
                  std::__cxx11::ostringstream::ostringstream(local_880);
                  poVar7 = std::operator<<((ostream *)local_880,"xss::rules: invalid attributes[");
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1b0);
                  poVar7 = std::operator<<(poVar7,"].type=");
                  std::operator<<(poVar7,local_528);
                  uVar6 = __cxa_allocate_exception(0x30);
                  std::__cxx11::ostringstream::str();
                  cppcms_error::cppcms_error
                            ((cppcms_error *)in_stack_fffffffffffff200,
                             (string *)CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8)
                            );
                  __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
                }
                rules::add_property((rules *)in_stack_fffffffffffff210,in_stack_fffffffffffff208,
                                    &in_stack_fffffffffffff200->first,
                                    (validator_type *)
                                    CONCAT44(in_stack_fffffffffffff1fc,in_stack_fffffffffffff1f8));
              }
            }
          }
        }
      }
      std::function<bool_(const_char_*,_const_char_*)>::~function
                ((function<bool_(const_char_*,_const_char_*)> *)0x457b8d);
      booster::regex::~regex(local_618);
      std::__cxx11::string::~string(local_528);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffff210);
    }
    std::
    set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~set((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x457c10);
    local_144 = 0;
  }
  json::value::~value((value *)0x457c28);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x457c35);
  std::__cxx11::string::~string(local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff210);
  return;
}

Assistant:

void load_from_json(rules &r,json::value const &v)
		{
			char const *last="";
			int pos = -1,pos2=-1;
			try {
				last="xhtml";
				r.html(v.get("xhtml",true) ? rules::xhtml_input : rules::html_input);
				last="comments";
				r.comments_allowed(v.get("comments",false));
				last="numeric_entities";
				r.numeric_entities_allowed(v.get("numeric_entities",false));
				typedef std::vector<std::string> str_vec;
				last="entities";
				str_vec entities = v.get("entities",str_vec());
				for(size_t i=0;i<entities.size();i++) {
					r.add_entity(entities[i]);
				}
				last="encoding";
				std::string encoding = v.get("encoding","");
				if(!encoding.empty()) {
					r.encoding(encoding);
				}
				std::set<std::string> all_tags;
				last="tags.opening_and_closing";
				load_tags_from_json(r,v,"opening_and_closing",rules::opening_and_closing,all_tags);
				last="tags.stand_alone";
				load_tags_from_json(r,v,"stand_alone",rules::stand_alone,all_tags);
				last="tags.any_tag";
				load_tags_from_json(r,v,"any_tag",rules::any_tag,all_tags);
				json::value attrs_val = v.find("attributes");
				if(attrs_val.is_undefined())
					return;
				if(attrs_val.type()!=json::is_array) {
					throw cppcms_error("xss::rules: attributes is expected to be an array");
				}
				json::array const &attributes = attrs_val.array();
				std::set<std::pair<std::string,std::string> > all_tags_attrs;
				for(size_t i=0;i< attributes.size();i++) {
					pos = i;
					if(attributes[i].type()!=json::is_object) {
						throw cppcms_error("xss::rules: attributes is expected to be an array of objects");
					}
					std::vector<std::pair<std::string,std::string> > all_new_pairs;

					json::value const &attr = attributes[i];

					{ // add tags/attr
						last="attributes[{1}].tags";
						str_vec tags = attr.get("tags",str_vec());
						last="attributes[{1}].attributes";
						str_vec names = attr.get("attributes",str_vec());
						for(size_t j=0;j<tags.size();j++) 
							for(size_t k=0;k<names.size();k++)
								all_new_pairs.push_back(std::make_pair(tags[j],names[k]));
					}
		
					{ // add pairs
						json::value const &pairs = attr.find("pairs");
						if(!pairs.is_undefined()) {
							if(pairs.type()!=json::is_array) {
								std::ostringstream ss;
								ss << "xss::rules: invalid object type for attributes[" 
									<< i <<"].pairs";
								throw cppcms_error(ss.str());
							}
							json::array const &ar=pairs.array();
							for(size_t j=0;j<ar.size();j++) {
								pos2=j;
								last="attributes[{1}].pairs[{2}].tag";
								std::string tag=ar[j].get<std::string>("tag");
								last="attributes[{1}].pairs[{2}].attr";
								std::string attr=ar[j].get<std::string>("attr");
								all_new_pairs.push_back(std::make_pair(tag,attr));
							}
						}
					}

					if(all_new_pairs.empty()) {
						throw cppcms_error("xss::rules: no tags/attributes defined in attributes");
					}

					last="attributes[{1}].type";
					std::string type = attr.get<std::string>("type");

					for(size_t j=0;j<all_new_pairs.size();j++) {
						std::string const &tag=all_new_pairs[j].first;
						std::string const &attr=all_new_pairs[j].second;
						if(all_tags.count(tag)!=1)
							throw cppcms_error("xss::rules: tags " + tag 
									+ " enlisted in attributes set"
									"is not defined in tags part");
						if(all_tags_attrs.insert(all_new_pairs[j]).second == false) 
							throw cppcms_error("xss::rules: duplicate tag/attribute pair: " 
									+ tag + ":" + attr);
					}
					
					booster::regex rg;
					rules::validator_type validator;
					
					if(type == "regex") {
						last="attributes[{1}].expression";
						rg = booster::regex(attr.get<std::string>("expression"));
					}

					if(type=="uri" || type=="absolute_uri") {
						bool absolute_only = type != "uri";
						last="attributes[{1}].scheme";
						std::string scheme = attr.get<std::string>("scheme",basic_allowed_schemes);
						validator = rules::uri_validator(scheme,absolute_only);
					}

					for(size_t j=0;j<all_new_pairs.size();j++) {
						std::string const &tag  =all_new_pairs[j].first;
						std::string const &attr =all_new_pairs[j].second;

						if(type == "boolean")
							r.add_boolean_property(tag,attr);
						else if(type == "integer")
							r.add_integer_property(tag,attr);
						else if(type == "relative_uri") 
							r.add_property(tag,attr,rules::relative_uri_validator());
						else if(type == "regex") 
							r.add_property(tag,attr,rg);
						else if(type == "uri" || type == "absolute_uri") 
							r.add_property(tag,attr,validator);
						else {
							std::ostringstream ss;
							ss <<"xss::rules: invalid attributes[" << i << "].type="<<type;
							throw cppcms_error(ss.str());
						}
					}
				} // for attributes
			}
			catch(json::bad_value_cast const &) {
				std::ostringstream ss;
				ss << "xss::rules:invalid type for "
				   << booster::locale::format(last) % pos % pos2;
				throw cppcms_error(ss.str());
			}
		}